

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionPrintfInfo
          (ValidationState_t *_,Instruction *inst)

{
  ulong uVar1;
  Instruction *pIVar2;
  bool bVar3;
  uint uVar4;
  Op OVar5;
  DiagnosticStream *pDVar6;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar7;
  DiagnosticStream local_5b0;
  ulong local_3d8;
  size_t i;
  DiagnosticStream local_1f8;
  Instruction *local_20;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_20 = inst;
  inst_local = (Instruction *)_;
  uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  bVar3 = IsUint32Constant(_,uVar4);
  pIVar2 = inst_local;
  if (bVar3) {
    uVar4 = Instruction::GetOperandAs<unsigned_int>(local_20,5);
    OVar5 = ValidationState_t::GetIdOpcode((ValidationState_t *)pIVar2,uVar4);
    if (OVar5 == OpString) {
      local_3d8 = 6;
      while( true ) {
        uVar1 = local_3d8;
        this = Instruction::operands(local_20);
        sVar7 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this)
        ;
        pIVar2 = inst_local;
        if (sVar7 <= uVar1) break;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(local_20,local_3d8);
        bVar3 = IsUint32Constant((ValidationState_t *)pIVar2,uVar4);
        if (!bVar3) {
          ValidationState_t::diag
                    (&local_5b0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
          pDVar6 = DiagnosticStream::operator<<
                             (&local_5b0,
                              (char (*) [59])
                              "ArgumentSizes must be a 32-bit unsigned integer OpConstant");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          DiagnosticStream::~DiagnosticStream(&local_5b0);
          return __local._4_4_;
        }
        local_3d8 = local_3d8 + 1;
      }
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      ValidationState_t::diag
                ((DiagnosticStream *)&i,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 local_20);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&i,(char (*) [33])"FormatString must be an OpString");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&i);
    }
  }
  else {
    ValidationState_t::diag
              (&local_1f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
    pDVar6 = DiagnosticStream::operator<<
                       (&local_1f8,
                        (char (*) [54])"PrintfID must be a 32-bit unsigned integer OpConstant");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateClspvReflectionPrintfInfo(ValidationState_t& _,
                                               const Instruction* inst) {
  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(4))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "PrintfID must be a 32-bit unsigned integer OpConstant";
  }

  if (_.GetIdOpcode(inst->GetOperandAs<uint32_t>(5)) != spv::Op::OpString) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "FormatString must be an OpString";
  }

  for (size_t i = 6; i < inst->operands().size(); ++i) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(i))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "ArgumentSizes must be a 32-bit unsigned integer OpConstant";
    }
  }

  return SPV_SUCCESS;
}